

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase106::run(TestCase106 *this)

{
  bool bVar1;
  Schema SVar2;
  uint64_t uVar3;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StructSchema union1g;
  StructSchema schema;
  RawBrandedSchema *local_f8;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::StructSchema::Field>_2 aStack_f0;
  ArrayPtr<const_char> local_a8;
  Field u1f0s8;
  Field union1;
  
  local_f8 = (RawBrandedSchema *)(schemas::s_f47697362233ce52 + 0x48);
  schema = Schema::asStruct((Schema *)&local_f8);
  name.content.size_ = 5;
  name.content.ptr = "bit0";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&schema,name);
  if ((local_f8._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != nullptr\"",
               (char (*) [59])"failed: expected schema.findFieldByName(\"bit0\") != nullptr");
  }
  name_00.content.size_ = 7;
  name_00.content.ptr = "u1f0s8";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&schema,name_00);
  if ((local_f8._0_1_ == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == nullptr\"",
               (char (*) [61])"failed: expected schema.findFieldByName(\"u1f0s8\") == nullptr");
  }
  name_01.content.size_ = 7;
  name_01.content.ptr = "union1";
  StructSchema::getFieldByName(&union1,&schema,name_01);
  if (union1.proto._reader.dataSize < 0xc0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(uint64_t *)((long)union1.proto._reader.data + 0x10);
  }
  local_f8 = (RawBrandedSchema *)Schema::getDependency(&schema.super_Schema,uVar3);
  union1g = Schema::asStruct((Schema *)&local_f8);
  Schema::getProto((Reader *)&local_f8,&union1g.super_Schema);
  if ((uint)aStack_f0._24_4_ < 0xc0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(uint64_t *)(aStack_f0._8_8_ + 0x10);
  }
  SVar2 = Schema::getDependency(&union1g.super_Schema,uVar3);
  if ((schema.super_Schema.raw != (Schema)SVar2.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_f8,&union1g.super_Schema);
    if ((uint)aStack_f0._24_4_ < 0xc0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(uint64_t *)(aStack_f0._8_8_ + 0x10);
    }
    u1f0s8.parent.super_Schema = Schema::getDependency(&union1g.super_Schema,uVar3);
    kj::_::Debug::log<char_const(&)[86],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", schema, union1g.getDependency(union1g.getProto().getScopeId())"
               ,(char (*) [86])
                "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
               ,&schema,(Schema *)&u1f0s8);
  }
  name_02.content.size_ = 5;
  name_02.content.ptr = "bin0";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_02);
  if ((local_f8._0_1_ == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == nullptr\"",
               (char (*) [60])"failed: expected union1g.findFieldByName(\"bin0\") == nullptr");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f0s8";
  StructSchema::getFieldByName(&u1f0s8,&union1g,name_03);
  aStack_f0.value.proto._reader.capTable = (CapTableReader *)u1f0s8.proto._reader._32_8_;
  aStack_f0.value.proto._reader.data = (void *)u1f0s8.proto._reader._40_8_;
  aStack_f0._8_8_ = u1f0s8.proto._reader.data;
  aStack_f0.value.proto._reader.segment = (SegmentReader *)u1f0s8.proto._reader.pointers;
  local_f8 = (RawBrandedSchema *)u1f0s8.proto._reader.segment;
  aStack_f0.value.parent.super_Schema.raw =
       (StructSchema)(StructSchema)u1f0s8.proto._reader.capTable;
  local_a8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_f8);
  bVar1 = kj::operator==("u1f0s8",(StringPtr *)&local_a8);
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    aStack_f0.value.proto._reader.capTable = (CapTableReader *)u1f0s8.proto._reader._32_8_;
    aStack_f0.value.proto._reader.data = (void *)u1f0s8.proto._reader._40_8_;
    aStack_f0._8_8_ = u1f0s8.proto._reader.data;
    aStack_f0.value.proto._reader.segment = (SegmentReader *)u1f0s8.proto._reader.pointers;
    local_f8 = (RawBrandedSchema *)u1f0s8.proto._reader.segment;
    aStack_f0.value.parent.super_Schema.raw =
         (StructSchema)(StructSchema)u1f0s8.proto._reader.capTable;
    local_a8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&local_f8);
    kj::_::Debug::log<char_const(&)[61],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", \"u1f0s8\", u1f0s8.getProto().getName()"
               ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
               (char (*) [7])"u1f0s8",(Reader *)&local_a8);
  }
  if ((u1f0s8.parent.super_Schema.raw != union1g.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x77,ERROR,"\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\"",
               (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g");
  }
  name_04.content.size_ = 7;
  name_04.content.ptr = "u1f1s8";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_04);
  if ((local_f8._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s8\") != nullptr");
  }
  name_05.content.size_ = 8;
  name_05.content.ptr = "u1f0s32";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_05);
  if ((local_f8._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != nullptr\"",
               (char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0s32\") != nullptr");
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u1f0sp";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_06);
  if ((local_f8._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f0sp\") != nullptr");
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "u1f1s1";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_07);
  if ((local_f8._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s1\") != nullptr");
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "u0f0s1";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_08);
  if ((local_f8._0_1_ == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u0f0s1\") == nullptr");
  }
  name_09.content.size_ = 7;
  name_09.content.ptr = "u2f0s8";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_09);
  if ((local_f8._0_1_ == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u2f0s8\") == nullptr");
  }
  name_10.content.size_ = 0xc;
  name_10.content.ptr = "noSuchField";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_f8,&union1g,name_10);
  if ((local_f8._0_1_ == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
               (char (*) [67])"failed: expected union1g.findFieldByName(\"noSuchField\") == nullptr"
              );
  }
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == nullptr);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == nullptr);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != nullptr);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == nullptr);
}